

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O0

int cfg_validate_int(autobuf *out,char *section_name,char *entry_name,char *value,int64_t min,
                    int64_t max,uint16_t bytelen,uint16_t fraction)

{
  int64_t iVar1;
  char *pcVar2;
  char *autobuf;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 local_98 [8];
  isonumber_str hbuf;
  uint64_t scaling;
  uint64_t j;
  int64_t max64;
  int64_t min64;
  int64_t i;
  int64_t max_local;
  int64_t min_local;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  autobuf *out_local;
  
  hbuf.buf[0x28] = '\x01';
  hbuf.buf[0x29] = '\0';
  hbuf.buf[0x2a] = '\0';
  hbuf.buf[0x2b] = '\0';
  hbuf.buf[0x2c] = '\0';
  hbuf.buf[0x2d] = '\0';
  hbuf.buf[0x2e] = '\0';
  hbuf.buf[0x2f] = '\0';
  for (scaling = 0; scaling < fraction; scaling = scaling + 1) {
    hbuf.buf._40_8_ = hbuf.buf._40_8_ * 10;
  }
  i = max;
  max_local = min;
  min_local = (int64_t)value;
  value_local = entry_name;
  entry_name_local = section_name;
  section_name_local = (char *)out;
  iVar3 = isonumber_to_s64(&min64,value,hbuf.buf._40_8_);
  if (iVar3 == 0) {
    if ((min64 < -0x8000000000000000 >> (('\b' - (char)bytelen) * '\b' & 0x3fU)) ||
       (0x7fffffffffffffff >> (('\b' - (char)bytelen) * '\b' & 0x3fU) < min64)) {
      pcVar5 = "large";
      if (min64 < max_local) {
        pcVar5 = "small";
      }
      cfg_append_printable_line
                ((autobuf *)section_name_local,
                 "Value \'%s\' for entry \'%s\' in section %s is too %s for a %d-hyte integer with %d fractional digits"
                 ,min_local,value_local,entry_name_local,pcVar5,(uint)bytelen,(uint)fraction);
    }
    autobuf = section_name_local;
    pcVar2 = entry_name_local;
    pcVar5 = value_local;
    iVar1 = min_local;
    if (min64 < max_local) {
      uVar4 = isonumber_from_s64(local_98,max_local,"",hbuf.buf._40_8_,1);
      cfg_append_printable_line
                ((autobuf *)autobuf,"Value \'%s\' for entry \'%s\' in section %s is smaller than %s"
                 ,iVar1,pcVar5,pcVar2,uVar4);
      out_local._4_4_ = -1;
    }
    else if (i < min64) {
      uVar4 = isonumber_from_s64(local_98,max_local,"",hbuf.buf._40_8_,1);
      cfg_append_printable_line
                ((autobuf *)autobuf,"Value \'%s\' for entry \'%s\' in section %s is larger than %s",
                 iVar1,pcVar5,pcVar2,uVar4);
      out_local._4_4_ = -1;
    }
    else {
      out_local._4_4_ = 0;
    }
  }
  else {
    if (fraction == 0) {
      cfg_append_printable_line
                ((autobuf *)section_name_local,
                 "Value \'%s\' for entry \'%s\' in section %s is not a %d-byte integer.",min_local,
                 value_local,entry_name_local,(ulong)bytelen);
    }
    else {
      cfg_append_printable_line
                ((autobuf *)section_name_local,
                 "Value \'%s\' for entry \'%s\' in section %s is not a fractional %d-byte integer with a maximum of %d fractional digits"
                 ,min_local,value_local,entry_name_local,(ulong)bytelen,(uint)fraction);
    }
    out_local._4_4_ = -1;
  }
  return out_local._4_4_;
}

Assistant:

int
cfg_validate_int(struct autobuf *out, const char *section_name, const char *entry_name, const char *value, int64_t min,
  int64_t max, uint16_t bytelen, uint16_t fraction) {
  int64_t i, min64, max64;
  uint64_t j, scaling;
  struct isonumber_str hbuf;

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);
  if (isonumber_to_s64(&i, value, scaling)) {
    if (fraction) {
      cfg_append_printable_line(out,
        "Value '%s' for entry '%s'"
        " in section %s is not a fractional %d-byte integer"
        " with a maximum of %d fractional digits",
        value, entry_name, section_name, bytelen, fraction);
    }
    else {
      cfg_append_printable_line(out,
        "Value '%s' for entry '%s'"
        " in section %s is not a %d-byte integer.",
        value, entry_name, section_name, bytelen);
    }
    return -1;
  }

  min64 = INT64_MIN >> (8 * (8 - bytelen));
  max64 = INT64_MAX >> (8 * (8 - bytelen));

  if (i < min64 || i > max64) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "too %s for a %d-hyte integer with %d fractional digits",
      value, entry_name, section_name, i < min ? "small" : "large", bytelen, fraction);
  }

  if (i < min) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "smaller than %s",
      value, entry_name, section_name, isonumber_from_s64(&hbuf, min, "", scaling, true));
    return -1;
  }
  if (i > max) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s' in section %s is "
      "larger than %s",
      value, entry_name, section_name, isonumber_from_s64(&hbuf, min, "", scaling, true));
    return -1;
  }
  return 0;
}